

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O2

int deqp::gles3::Functional::getVectorsFromComps(Functions *gl,deUint32 pname)

{
  GLenum err;
  int value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  code *local_28;
  deUint32 local_20;
  
  value = -1;
  (*gl->getIntegerv)(pname,&value);
  err = (*gl->getError)();
  local_28 = glu::getGettableStateName;
  local_20 = pname;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_48,&local_28);
  std::operator+(&local_88,"glGetIntegerv(",&local_48);
  std::operator+(&local_68,&local_88,")");
  glu::checkError(err,local_68._M_dataplus._M_p,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                  ,0x4b);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_48);
  return value / 4;
}

Assistant:

static int getVectorsFromComps (const glw::Functions& gl, deUint32 pname)
{
	int value = -1;
	gl.getIntegerv(pname, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), ("glGetIntegerv(" + glu::getGettableStateStr((int)pname).toString() + ")").c_str());
	// Accept truncated division. According to the spec, the number of vectors is number of components divided by four, plain and simple.
	return value/4;
}